

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O3

int __thiscall
TPZSFMatrix<long_double>::Subst_LBackward(TPZSFMatrix<long_double> *this,TPZFMatrix<long_double> *B)

{
  long lVar1;
  longdouble lVar2;
  bool bVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int extraout_var_01;
  undefined4 extraout_var_02;
  int iVar10;
  long lVar11;
  longdouble *plVar12;
  long lVar13;
  longdouble *plVar14;
  long lVar15;
  longdouble in_ST0;
  longdouble lVar16;
  longdouble in_ST1;
  longdouble lVar17;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  long local_70;
  longdouble local_48;
  
  lVar11 = (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  iVar8 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  iVar10 = 0;
  if ((lVar11 == CONCAT44(extraout_var,iVar8)) &&
     ((this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed != '\0')) {
    iVar8 = (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x10])(B);
    if (iVar8 != 0) {
      TPZMatrix<long_double>::Error
                ("virtual int TPZSFMatrix<long double>::Subst_LBackward(TPZFMatrix<TVar> *) const [TVar = long double]"
                 ,"Subst_LBackward <the matrix result can not be simetric>");
    }
    plVar14 = this->fElem;
    iVar8 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x4b])(this);
    iVar9 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0xc])(this);
    iVar10 = 1;
    if (CONCAT44(extraout_var_01,iVar9) != 0 && -1 < extraout_var_01) {
      plVar14 = plVar14 + CONCAT44(extraout_var_00,iVar8);
      lVar11 = (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
      local_70 = CONCAT44(extraout_var_01,iVar9);
      do {
        plVar14 = plVar14 + -1;
        lVar1 = local_70 + -1;
        if (0 < lVar11) {
          lVar13 = 0;
          do {
            iVar8 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0xc])(this);
            lVar11 = CONCAT44(extraout_var_02,iVar8);
            lVar17 = (longdouble)0;
            lVar16 = in_ST0;
            lVar2 = in_ST1;
            lVar4 = in_ST2;
            lVar5 = in_ST3;
            lVar6 = in_ST4;
            lVar7 = in_ST5;
            if (local_70 < lVar11) {
              lVar15 = -lVar11;
              lVar17 = (longdouble)0;
              plVar12 = plVar14;
              do {
                lVar16 = in_ST1;
                lVar15 = lVar15 + 1;
                lVar11 = lVar11 + -1;
                lVar2 = *plVar12;
                (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x24])(B,lVar11,lVar13);
                lVar17 = lVar17 + lVar2 * in_ST0;
                plVar12 = plVar12 + lVar15;
                in_ST0 = lVar16;
                lVar2 = in_ST2;
                in_ST1 = in_ST2;
                lVar4 = in_ST3;
                in_ST2 = in_ST3;
                lVar5 = in_ST4;
                in_ST3 = in_ST4;
                lVar6 = in_ST5;
                in_ST4 = in_ST5;
                lVar7 = in_ST6;
                in_ST5 = in_ST6;
              } while (local_70 < lVar11);
            }
            in_ST5 = in_ST6;
            in_ST4 = lVar7;
            in_ST3 = lVar6;
            in_ST2 = lVar5;
            in_ST1 = lVar4;
            in_ST0 = lVar2;
            (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(B,lVar1,lVar13);
            local_48 = lVar16 - lVar17;
            in_ST6 = in_ST5;
            (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x23])(B,lVar1,lVar13,&local_48);
            lVar13 = lVar13 + 1;
            lVar11 = (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
          } while (lVar13 < lVar11);
        }
        bVar3 = 1 < local_70;
        local_70 = lVar1;
      } while (bVar3);
      iVar10 = 1;
    }
  }
  return iVar10;
}

Assistant:

int
TPZSFMatrix<TVar> ::Subst_LBackward( TPZFMatrix<TVar>  *B ) const
{
	if ( (B->Rows() != this->Dim()) || !this->fDecomposed )
		return( 0 );
	
	if ( B->IsSymmetric() )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Subst_LBackward <the matrix result can not be simetric>" );
	
	TVar *ptr_k = &fElem[ Size()-1 ];
	for ( int64_t k = this->Dim()-1; k >= 0; k--, ptr_k-- )
		for ( int64_t j = 0; j < B->Cols(); j++ )
		{
			// Faz sum = SOMA( A[k,i] * B[i,j] ); i = N, ..., k+1.
			//
			TVar sum = 0.0;
			TVar *pk = ptr_k;
			for ( int64_t i = this->Dim()-1; i > k; i-- )
			{
				if constexpr (is_complex<TVar>::value){
					sum += std::conj(*pk) * B->GetVal( i, j );
				}else{
					sum += *pk * B->GetVal( i, j );
				}
				pk -= i;
			}
			
			// Faz B[k,j] = B[k,j] - sum.
			//
			B->PutVal( k, j, B->GetVal(k, j) - sum );
		}
	
	return( 1 );
}